

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityParamXYZ.cpp
# Opt level: O0

void __thiscall
OpenMD::TetrahedralityParamXYZ::TetrahedralityParamXYZ
          (TetrahedralityParamXYZ *this,SimInfo *info,string *filename,string *sele1,string *sele2,
          RealType rCut,RealType voxelSize,RealType gaussWidth)

{
  int iVar1;
  bool bVar2;
  SnapshotManager *this_00;
  double *pdVar3;
  int *piVar4;
  reference pvVar5;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  string *in_RCX;
  SimInfo *in_RSI;
  undefined8 *in_RDI;
  string *in_R8;
  undefined8 in_XMM0_Qa;
  double dVar6;
  double in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  SimInfo *in_stack_00000018;
  SelectionManager *in_stack_00000020;
  int j;
  int i;
  Mat3x3d hmat;
  undefined4 in_stack_fffffffffffffd68;
  uint in_stack_fffffffffffffd6c;
  StaticAnalyser *in_stack_fffffffffffffd70;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffd78;
  StaticAnalyser *in_stack_fffffffffffffd80;
  int *in_stack_fffffffffffffd88;
  reference in_stack_fffffffffffffd90;
  SelectionEvaluator *in_stack_fffffffffffffda8;
  string *in_stack_fffffffffffffdb8;
  SelectionEvaluator *in_stack_fffffffffffffdc0;
  SimInfo *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  string local_140 [32];
  string local_120 [32];
  undefined8 local_100;
  double *local_f8;
  double *local_f0;
  undefined8 local_e8;
  double *local_e0;
  double *local_d8;
  int local_d0;
  int local_cc;
  RectMatrix<double,_3U,_3U> local_c8;
  undefined8 local_40;
  double local_38;
  undefined8 local_30;
  string *local_28;
  string *local_20;
  SimInfo *local_10;
  
  local_40 = in_XMM2_Qa;
  local_38 = in_XMM1_Qa;
  local_30 = in_XMM0_Qa;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  StaticAnalyser::StaticAnalyser
            (in_stack_fffffffffffffd80,(SimInfo *)in_stack_fffffffffffffd78._M_current,
             (string *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
  *in_RDI = &PTR__TetrahedralityParamXYZ_00560510;
  std::__cxx11::string::string((string *)(in_RDI + 0x1a),local_20);
  std::__cxx11::string::string((string *)(in_RDI + 0x1e),local_28);
  SelectionManager::SelectionManager(in_stack_00000020,in_stack_00000018);
  SelectionManager::SelectionManager(in_stack_00000020,in_stack_00000018);
  SelectionEvaluator::SelectionEvaluator
            ((SelectionEvaluator *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
             in_stack_fffffffffffffe68);
  SelectionEvaluator::SelectionEvaluator
            ((SelectionEvaluator *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
             in_stack_fffffffffffffe68);
  in_RDI[0x1a8] = local_30;
  in_RDI[0x1a9] = local_38;
  in_RDI[0x1aa] = local_40;
  Vector3<int>::Vector3((Vector3<int> *)0x1e5569);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
            *)0x1e5587);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
            *)0x1e55a3);
  SelectionEvaluator::loadScriptString(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  bVar2 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x54));
  if (!bVar2) {
    SelectionEvaluator::evaluate(in_stack_fffffffffffffda8);
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffd80,
               (SelectionSet *)in_stack_fffffffffffffd78._M_current);
    SelectionSet::~SelectionSet((SelectionSet *)0x1e5642);
  }
  SelectionEvaluator::loadScriptString(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  bVar2 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0xfe));
  if (!bVar2) {
    SelectionEvaluator::evaluate(in_stack_fffffffffffffda8);
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffd80,
               (SelectionSet *)in_stack_fffffffffffffd78._M_current);
    SelectionSet::~SelectionSet((SelectionSet *)0x1e57d0);
  }
  this_00 = SimInfo::getSnapshotManager(local_10);
  SnapshotManager::getCurrentSnapshot(this_00);
  Snapshot::getHmat((Snapshot *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_c8,0,0);
  dVar6 = *pdVar3 / local_38;
  piVar4 = Vector<int,_3U>::operator()((Vector<int,_3U> *)(in_RDI + 0x1ab),0);
  *piVar4 = (int)dVar6;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_c8,1,1);
  dVar6 = *pdVar3 / local_38;
  piVar4 = Vector<int,_3U>::operator()((Vector<int,_3U> *)(in_RDI + 0x1ab),1);
  *piVar4 = (int)dVar6;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_c8,2,2);
  dVar6 = *pdVar3;
  piVar4 = Vector<int,_3U>::operator()((Vector<int,_3U> *)(in_RDI + 0x1ab),2);
  *piVar4 = (int)(dVar6 / local_38);
  Vector<int,_3U>::operator()((Vector<int,_3U> *)(in_RDI + 0x1ab),0);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
            *)in_stack_fffffffffffffd90,(size_type)in_stack_fffffffffffffd88);
  Vector<int,_3U>::operator()((Vector<int,_3U> *)(in_RDI + 0x1ab),0);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
            *)in_stack_fffffffffffffd90,(size_type)in_stack_fffffffffffffd88);
  local_cc = 0;
  while( true ) {
    iVar1 = local_cc;
    piVar4 = Vector<int,_3U>::operator()((Vector<int,_3U> *)(in_RDI + 0x1ab),0);
    if (*piVar4 <= iVar1) break;
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                  *)(in_RDI + 0x1b0),(long)local_cc);
    Vector<int,_3U>::operator()((Vector<int,_3U> *)(in_RDI + 0x1ab),1);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffd90,(size_type)in_stack_fffffffffffffd88);
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                  *)(in_RDI + 0x1ad),(long)local_cc);
    Vector<int,_3U>::operator()((Vector<int,_3U> *)(in_RDI + 0x1ab),1);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffd90,(size_type)in_stack_fffffffffffffd88);
    local_d0 = 0;
    while( true ) {
      iVar1 = local_d0;
      piVar4 = Vector<int,_3U>::operator()((Vector<int,_3U> *)(in_RDI + 0x1ab),1);
      if (*piVar4 <= iVar1) break;
      pvVar5 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)(in_RDI + 0x1b0),(long)local_cc);
      in_stack_fffffffffffffd90 =
           std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](pvVar5,(long)local_d0);
      Vector<int,_3U>::operator()((Vector<int,_3U> *)(in_RDI + 0x1ab),2);
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffd90,(size_type)in_stack_fffffffffffffd88);
      pvVar5 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)(in_RDI + 0x1ad),(long)local_cc);
      __first._M_current =
           (double *)
           std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](pvVar5,(long)local_d0);
      in_stack_fffffffffffffd88 = Vector<int,_3U>::operator()((Vector<int,_3U> *)(in_RDI + 0x1ab),2)
      ;
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffd90,(size_type)in_stack_fffffffffffffd88);
      in_stack_fffffffffffffd78._M_current = (double *)(in_RDI + 0x1b0);
      pvVar5 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)in_stack_fffffffffffffd78._M_current,(long)local_cc);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](pvVar5,(long)local_d0);
      local_d8 = (double *)
                 std::vector<double,_std::allocator<double>_>::begin
                           ((vector<double,_std::allocator<double>_> *)
                            CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      pvVar5 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)in_stack_fffffffffffffd78._M_current,(long)local_cc);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](pvVar5,(long)local_d0);
      local_e0 = (double *)
                 std::vector<double,_std::allocator<double>_>::end
                           ((vector<double,_std::allocator<double>_> *)
                            CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      local_e8 = 0;
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                (__first,in_stack_fffffffffffffd78,(double *)in_stack_fffffffffffffd70);
      in_stack_fffffffffffffd70 = (StaticAnalyser *)(in_RDI + 0x1ad);
      pvVar5 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)in_stack_fffffffffffffd70,(long)local_cc);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](pvVar5,(long)local_d0);
      local_f0 = (double *)
                 std::vector<double,_std::allocator<double>_>::begin
                           ((vector<double,_std::allocator<double>_> *)
                            CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      pvVar5 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)in_stack_fffffffffffffd70,(long)local_cc);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](pvVar5,(long)local_d0);
      local_f8 = (double *)
                 std::vector<double,_std::allocator<double>_>::end
                           ((vector<double,_std::allocator<double>_> *)
                            CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      local_100 = 0;
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                (__first,in_stack_fffffffffffffd78,(double *)in_stack_fffffffffffffd70);
      local_d0 = local_d0 + 1;
    }
    local_cc = local_cc + 1;
  }
  getPrefix((string *)in_stack_fffffffffffffd78._M_current);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd78._M_current,(char *)in_stack_fffffffffffffd70);
  StaticAnalyser::setOutputName
            (in_stack_fffffffffffffd70,
             (string *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_140);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1e5e20);
  return;
}

Assistant:

TetrahedralityParamXYZ::TetrahedralityParamXYZ(
      SimInfo* info, const std::string& filename, const std::string& sele1,
      const std::string& sele2, RealType rCut, RealType voxelSize,
      RealType gaussWidth) :
      StaticAnalyser(info, filename, 1),
      selectionScript1_(sele1), selectionScript2_(sele2), seleMan1_(info),
      seleMan2_(info), evaluator1_(info), evaluator2_(info), rCut_(rCut),
      voxelSize_(voxelSize), gaussWidth_(gaussWidth) {
    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }
    evaluator2_.loadScriptString(sele2);
    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
    }

    Mat3x3d hmat = info->getSnapshotManager()->getCurrentSnapshot()->getHmat();

    nBins_(0) = int(hmat(0, 0) / voxelSize);
    nBins_(1) = int(hmat(1, 1) / voxelSize);
    nBins_(2) = int(hmat(2, 2) / voxelSize);

    hist_.resize(nBins_(0));
    count_.resize(nBins_(0));
    for (int i = 0; i < nBins_(0); ++i) {
      hist_[i].resize(nBins_(1));
      count_[i].resize(nBins_(1));
      for (int j = 0; j < nBins_(1); ++j) {
        hist_[i][j].resize(nBins_(2));
        count_[i][j].resize(nBins_(2));
        std::fill(hist_[i][j].begin(), hist_[i][j].end(), 0.0);
        std::fill(count_[i][j].begin(), count_[i][j].end(), 0.0);
      }
    }

    setOutputName(getPrefix(filename) + ".Qxyz");
  }